

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O0

list<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
StackTrace::return_stack_trace_abi_cxx11_
          (list<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          StackTrace *this,size_t address)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator cVar3;
  undefined1 auStack_68 [8];
  pair<unsigned_long,_unsigned_long> data;
  undefined1 local_38 [8];
  const_iterator it;
  lock_guard<ipc::spinlock> lg;
  size_t address_local;
  StackTrace *this_local;
  
  lg._M_device = (mutex_type *)address;
  std::lock_guard<ipc::spinlock>::lock_guard
            ((lock_guard<ipc::spinlock> *)&it.inner_.field_1,&this->lock);
  cVar3 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                      *)this,(key_arg<unsigned_long> *)&lg);
  it.inner_.ctrl_ = (ctrl_t *)cVar3.inner_.field_1;
  local_38 = (undefined1  [8])cVar3.inner_.ctrl_;
  cVar3 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::end((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *)this);
  data.second = (unsigned_long)cVar3.inner_.ctrl_;
  bVar1 = phmap::container_internal::operator!=
                    ((const_iterator *)local_38,(const_iterator *)&data.second);
  if (bVar1) {
    ppVar2 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::const_iterator::operator->((const_iterator *)local_38);
    auStack_68 = (undefined1  [8])(ppVar2->second).first;
    data.first = (ppVar2->second).second;
    make_trace_abi_cxx11_
              (__return_storage_ptr__,this,(pair<unsigned_long,_unsigned_long> *)auStack_68);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list(__return_storage_ptr__);
  }
  std::lock_guard<ipc::spinlock>::~lock_guard((lock_guard<ipc::spinlock> *)&it.inner_.field_1);
  return __return_storage_ptr__;
}

Assistant:

std::list<size_t> StackTrace::return_stack_trace(size_t address) const {
  std::lock_guard<ipc::spinlock> lg(lock);
  auto it = _read_write.find(address);
  if (it != _read_write.end()) {
    auto data = it->second;
    return make_trace(data);
  }
  // A read/write operation was not tracked correctly -> return empty stack
  // trace
  return {};
}